

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoarimatest3.c
# Opt level: O3

int main(void)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  double *xpred;
  double *amse;
  FILE *__stream;
  double *pdVar6;
  double *pdVar7;
  double *newxreg;
  auto_arima_object obj;
  ulong uVar8;
  undefined1 *puVar9;
  long lVar10;
  int iVar11;
  undefined4 uVar12;
  undefined1 local_70e8 [8];
  double temp [1200];
  double temp1 [1200];
  double temp2 [1200];
  int order [3];
  int seasonal [3];
  
  temp2[0x4af] = 4.24399158440087e-314;
  order[0] = 5;
  order[1] = 2;
  order[2] = 1;
  xpred = (double *)malloc(0x28);
  amse = (double *)malloc(0x28);
  __stream = fopen("../data/e1m.dat","r");
  if (__stream != (FILE *)0x0) {
    iVar5 = feof(__stream);
    iVar11 = 0;
    if (iVar5 == 0) {
      pdVar6 = temp1 + 0x4af;
      pdVar7 = temp + 0x4af;
      puVar9 = local_70e8;
      iVar11 = 0;
      do {
        __isoc99_fscanf(__stream,"%lf %lf %lf \n",puVar9,pdVar7,pdVar6);
        iVar5 = feof(__stream);
        pdVar6 = pdVar6 + 1;
        pdVar7 = pdVar7 + 1;
        puVar9 = puVar9 + 8;
        iVar11 = iVar11 + 1;
      } while (iVar5 == 0);
    }
    lVar10 = (long)iVar11;
    uVar1 = lVar10 - 5;
    pdVar6 = (double *)malloc(lVar10 * 8 - 0x28);
    pdVar7 = (double *)malloc(uVar1 * 0x10);
    newxreg = (double *)malloc(0x50);
    if (5 < iVar11) {
      memcpy(pdVar6,local_70e8,(uVar1 & 0xffffffff) * 8);
      uVar8 = 0;
      do {
        pdVar7[uVar8] = temp[uVar8 + 0x4af];
        pdVar7[uVar1 + uVar8] = temp1[uVar8 + 0x4af];
        uVar8 = uVar8 + 1;
      } while ((uVar1 & 0xffffffff) != uVar8);
    }
    newxreg[4] = temp[lVar10 + 0x4ae];
    dVar2 = temp[lVar10 + 0x4aa];
    dVar3 = temp[lVar10 + 0x4ab];
    dVar4 = temp[lVar10 + 0x4ad];
    newxreg[2] = temp[lVar10 + 0x4ac];
    newxreg[3] = dVar4;
    *newxreg = dVar2;
    newxreg[1] = dVar3;
    dVar2 = temp1[lVar10 + 0x4ab];
    dVar3 = temp1[lVar10 + 0x4ac];
    dVar4 = temp1[lVar10 + 0x4ad];
    newxreg[5] = temp1[lVar10 + 0x4aa];
    newxreg[6] = dVar2;
    newxreg[7] = dVar3;
    newxreg[8] = dVar4;
    newxreg[9] = temp1[lVar10 + 0x4ae];
    lVar10 = 0;
    obj = auto_arima_init((int *)(temp2 + 0x4af),order + 1,0,2,(int)uVar1);
    auto_arima_setApproximation(obj,1);
    auto_arima_setStepwise(obj,1);
    auto_arima_setVerbose(obj,1);
    auto_arima_exec(obj,pdVar6,pdVar7);
    auto_arima_summary(obj);
    auto_arima_predict(obj,pdVar6,pdVar7,5,newxreg,xpred,amse);
    putchar(10);
    printf("Predicted Values : ");
    do {
      printf("%g ",SUB84(xpred[lVar10],0));
      lVar10 = lVar10 + 1;
    } while (lVar10 != 5);
    putchar(10);
    lVar10 = 0;
    printf("Standard Errors  : ");
    do {
      dVar2 = amse[lVar10];
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
        uVar12 = SUB84(dVar2,0);
      }
      else {
        uVar12 = SUB84(SQRT(dVar2),0);
      }
      printf("%g ",uVar12);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 5);
    putchar(10);
    auto_arima_free(obj);
    free(pdVar6);
    free(xpred);
    free(amse);
    free(pdVar7);
    free(newxreg);
    return 0;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

int main(void) {
    int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	double *xpred, *amse,*xreg,*newxreg;
	auto_arima_object obj;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	p = 5;
	d = 2;
	q = 5;
	P = 2;
	D = 1;
	Q = 2;
	
	int order[3] = {p,d,q};
	int seasonal[3] = {P,D,Q};

    s = 0;
    r = 2;
	L = 5;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/e1m.dat", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf %lf %lf \n", &temp[i],&temp1[i],&temp2[i]);
		i++;
	}
	N = i - L;

	inp = (double*)malloc(sizeof(double)* N);
    xreg = (double*)malloc(sizeof(double)* N * 2);
    newxreg = (double*)malloc(sizeof(double)* L * 2);


	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        xreg[i] = temp1[i];
		xreg[N+i] = temp2[i];
	}

    for(i = 0; i < L;++i) {
        newxreg[i] = temp1[N + i];
        newxreg[i+L] = temp2[N + i];
    }

	obj = auto_arima_init(order,seasonal,s,r,N);

	auto_arima_setApproximation(obj,1);
	auto_arima_setStepwise(obj,1);
	auto_arima_setVerbose(obj,1);

	auto_arima_exec(obj,inp,xreg);

	auto_arima_summary(obj);

	auto_arima_predict(obj, inp, xreg, L,newxreg, xpred, amse);

	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");

	auto_arima_free(obj);

	
	free(inp);
	free(xpred);
	free(amse);
    free(xreg);
    free(newxreg);

    return 0;
}